

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhiwidget.cpp
# Opt level: O2

void __thiscall QRhiWidgetPrivate::ensureRhi(QRhiWidgetPrivate *this)

{
  function *pfVar1;
  QRhi *pQVar2;
  int iVar3;
  int iVar4;
  QRhi *pQVar5;
  undefined8 uVar6;
  long in_FS_OFFSET;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined8 uStack_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  code *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pfVar1 = *(function **)&(this->super_QWidgetPrivate).field_0x8;
  pQVar5 = QWidgetPrivate::rhi(&this->super_QWidgetPrivate);
  if (pQVar5 != (QRhi *)0x0) {
    iVar3 = QRhi::backend();
    iVar4 = QBackingStoreRhiSupport::apiToRhiBackend((this->config).m_api);
    if (iVar3 != iVar4) {
      local_50 = 2;
      uStack_3c = 0;
      uStack_4c = 0;
      uStack_48._0_4_ = 0;
      uStack_48._4_4_ = 0;
      uStack_40 = 0;
      local_38 = (code *)0x5e5d56;
      uVar6 = QRhi::backendName();
      QMessageLogger::warning
                ((char *)&local_50,
                 "The top-level window is already using another graphics API for composition, \'%s\' is not compatible with this widget"
                 ,uVar6);
      goto LAB_002e77a7;
    }
    pQVar2 = this->rhi;
    if (pQVar2 != pQVar5) {
      if (pQVar2 != (QRhi *)0x0) {
        if (pQVar2 == (this->offscreenRenderer).m_rhi) {
          (**(code **)(*(long *)pfVar1 + 0x1b0))(pfVar1);
          releaseResources(this);
          QBackingStoreRhiSupport::reset();
        }
        else {
          resetRenderTargetObjects(this);
          resetColorBufferObjects(this);
        }
      }
      local_50 = SUB84(pfVar1,0);
      uStack_4c = (undefined4)((ulong)pfVar1 >> 0x20);
      local_38 = std::
                 _Function_handler<void_(QRhi_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/kernel/qrhiwidget.cpp:522:43)>
                 ::_M_invoke;
      uStack_40 = 0x2e886c;
      uStack_3c = 0;
      uStack_48 = this;
      QRhi::addCleanupCallback(pQVar5,pfVar1);
      if ((code *)CONCAT44(uStack_3c,uStack_40) != (code *)0x0) {
        (*(code *)CONCAT44(uStack_3c,uStack_40))(&local_50,&local_50,3);
      }
    }
  }
  this->rhi = pQVar5;
LAB_002e77a7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRhiWidgetPrivate::ensureRhi()
{
    Q_Q(QRhiWidget);
    QRhi *currentRhi = QWidgetPrivate::rhi();
    if (currentRhi && currentRhi->backend() != QBackingStoreRhiSupport::apiToRhiBackend(config.api())) {
        qWarning("The top-level window is already using another graphics API for composition, "
                 "'%s' is not compatible with this widget",
                 currentRhi->backendName());
        return;
    }

    // NB the rhi member may be an invalid object, the pointer can be used, but no deref
    if (currentRhi && rhi != currentRhi) {
        if (rhi) {
            // if previously we created our own but now get a QRhi from the
            // top-level, then drop what we have and start using the top-level's
            if (rhi == offscreenRenderer.rhi()) {
                q->releaseResources(); // notify the user code about the early-release
                releaseResources();
                offscreenRenderer.reset();
            } else {
                // rhi resources created by us all belong to the old rhi, drop them;
                // due to nulling out colorTexture this is also what ensures that
                // initialize() is going to be called again eventually
                resetRenderTargetObjects();
                resetColorBufferObjects();
            }
        }

        // Normally the widget gets destroyed before the QRhi (which is managed by
        // the top-level's backingstore). When reparenting between top-levels is
        // involved, that is not always the case. Therefore we use a per-widget rhi
        // cleanup callback to get notified when the QRhi is about to be destroyed
        // while the QRhiWidget is still around.
        currentRhi->addCleanupCallback(q, [q, this](QRhi *regRhi) {
            if (!QWidgetPrivate::get(q)->data.in_destructor && this->rhi == regRhi) {
                q->releaseResources(); // notify the user code about the early-release
                releaseResources();
                // must null out our ref, the QRhi object is going to be invalid
                this->rhi = nullptr;
            }
        });
    }

    rhi = currentRhi;
}